

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.c
# Opt level: O0

err_t rngESRead(size_t *read,void *buf,size_t count,char *source)

{
  int iVar1;
  char *in_RCX;
  size_t *in_RDX;
  void *in_RSI;
  size_t *in_stack_00000020;
  void *in_stack_00000028;
  undefined4 local_4;
  
  iVar1 = strCmp((char *)in_RDX,in_RCX);
  if (iVar1 == 0) {
    local_4 = rngTRNGRead(in_RSI,in_RDX,(size_t)in_RCX);
  }
  else {
    iVar1 = strCmp((char *)in_RDX,in_RCX);
    if (iVar1 == 0) {
      local_4 = rngTRNG2Read(in_RSI,in_RDX,(size_t)in_RCX);
    }
    else {
      iVar1 = strCmp((char *)in_RDX,in_RCX);
      if (iVar1 == 0) {
        local_4 = rngTimerRead(read,(size_t *)buf,count);
      }
      else {
        iVar1 = strCmp((char *)in_RDX,in_RCX);
        if (iVar1 == 0) {
          local_4 = rngSysRead(in_RSI,in_RDX,(size_t)in_RCX);
        }
        else {
          iVar1 = strCmp((char *)in_RDX,in_RCX);
          if (iVar1 == 0) {
            local_4 = rngSys2Read(in_stack_00000028,in_stack_00000020,(size_t)read);
          }
          else {
            local_4 = 0xca;
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

err_t rngESRead(size_t* read, void* buf, size_t count, const char* source)
{
	if (strEq(source, "trng"))
		return rngTRNGRead(buf, read, count);
	else if (strEq(source, "trng2"))
		return rngTRNG2Read(buf, read, count);
	else if (strEq(source, "timer"))
		return rngTimerRead(buf, read, count);
	else if (strEq(source, "sys"))
		return rngSysRead(buf, read, count);
	else if (strEq(source, "sys2"))
		return rngSys2Read(buf, read, count);
	return ERR_FILE_NOT_FOUND;
}